

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountersReader.h
# Opt level: O3

void __thiscall
aeron::concurrent::CountersReader::validateCounterId(CountersReader *this,int32_t counterId)

{
  char *pcVar1;
  SourcedException *this_00;
  long *plVar2;
  char *pcVar3;
  size_type *psVar4;
  char *pcVar5;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((-1 < counterId) && (counterId <= this->m_maxCounterId)) {
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_e8,counterId);
  std::operator+(&local_68,"counter id ",&local_e8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_108._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar4) {
    local_108.field_2._M_allocated_capacity = *psVar4;
    local_108.field_2._8_8_ = plVar2[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar4;
  }
  local_108._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_88,this->m_maxCounterId);
  std::operator+(&local_48,&local_108,&local_88);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,
             "void aeron::concurrent::CountersReader::validateCounterId(std::int32_t) const","");
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/CountersReader.h"
  ;
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar3 = pcVar3 + 1;
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar3 == *pcVar1);
  std::__cxx11::string::string((string *)&local_a8,pcVar5 + (*pcVar1 == '/'),&local_109);
  util::SourcedException::SourcedException(this_00,&local_48,&local_c8,&local_a8,0xdb);
  *(undefined ***)this_00 = &PTR__SourcedException_00162a58;
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

void validateCounterId(std::int32_t counterId) const
    {
        if (counterId < 0 || counterId > m_maxCounterId)
        {
            throw util::IllegalArgumentException(
                "counter id " + std::to_string(counterId) +
                " out of range: maxCounterId=" + std::to_string(m_maxCounterId),
                SOURCEINFO);
        }
    }